

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImGui::GetKeyPressedAmount(int key_index,float repeat_delay,float repeat_rate)

{
  float fVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  if (key_index < 0) {
    return 0;
  }
  if (0x1ff < (uint)key_index) {
    __assert_fail("key_index >= 0 && key_index < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x1035,"int ImGui::GetKeyPressedAmount(int, float, float)");
  }
  fVar1 = (GImGui->IO).KeysDownDuration[(uint)key_index];
  iVar2 = 1;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    if (repeat_rate <= 0.0) {
      return 0;
    }
    iVar2 = 0;
    if (repeat_delay < fVar1) {
      auVar4._0_4_ = fVar1 - repeat_delay;
      auVar4._4_4_ = (fVar1 - (GImGui->IO).DeltaTime) - repeat_delay;
      auVar4._8_4_ = 0.0 - repeat_delay;
      auVar4._12_4_ = 0.0 - repeat_delay;
      auVar5._4_4_ = repeat_rate;
      auVar5._0_4_ = repeat_rate;
      auVar5._8_4_ = repeat_rate;
      auVar5._12_4_ = repeat_rate;
      auVar5 = divps(auVar4,auVar5);
      iVar3 = (int)auVar5._0_4_ - (int)auVar5._4_4_;
      iVar2 = 0;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int ImGui::GetKeyPressedAmount(int key_index, float repeat_delay, float repeat_rate)
{
    ImGuiContext& g = *GImGui;
    if (key_index < 0)
        return 0;
    IM_ASSERT(key_index >= 0 && key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[key_index];
    return CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, repeat_delay, repeat_rate);
}